

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::TestCaseFilter::TestCaseFilter(TestCaseFilter *this,string *testSpec,DoWhat matchBehaviour)

{
  DoWhat DVar1;
  bool bVar2;
  allocator local_39;
  string local_38;
  
  toLower(&this->m_stringToMatch,testSpec);
  this->m_filterType = matchBehaviour;
  this->m_wildcardPosition = NoWildcard;
  if (matchBehaviour != AutoDetectBehaviour) goto LAB_0013d9c3;
  std::__cxx11::string::string((string *)&local_38,"exclude:",&local_39);
  bVar2 = startsWith(&this->m_stringToMatch,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar2) {
    std::__cxx11::string::substr((ulong)&local_38,(ulong)this);
LAB_0013d9a1:
    std::__cxx11::string::operator=((string *)this,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    DVar1 = ExcludeTests;
  }
  else {
    std::__cxx11::string::string((string *)&local_38,"~",&local_39);
    bVar2 = startsWith(&this->m_stringToMatch,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (bVar2) {
      std::__cxx11::string::substr((ulong)&local_38,(ulong)this);
      goto LAB_0013d9a1;
    }
    DVar1 = IncludeTests;
  }
  this->m_filterType = DVar1;
LAB_0013d9c3:
  std::__cxx11::string::string((string *)&local_38,"*",&local_39);
  bVar2 = startsWith(&this->m_stringToMatch,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar2) {
    std::__cxx11::string::substr((ulong)&local_38,(ulong)this);
    std::__cxx11::string::operator=((string *)this,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    *(undefined1 *)&this->m_wildcardPosition = (char)this->m_wildcardPosition | WildcardAtStart;
  }
  std::__cxx11::string::string((string *)&local_38,"*",&local_39);
  bVar2 = endsWith(&this->m_stringToMatch,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar2) {
    std::__cxx11::string::substr((ulong)&local_38,(ulong)this);
    std::__cxx11::string::operator=((string *)this,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    *(undefined1 *)&this->m_wildcardPosition = (char)this->m_wildcardPosition | WildcardAtEnd;
  }
  return;
}

Assistant:

TestCaseFilter( std::string const& testSpec, IfFilterMatches::DoWhat matchBehaviour = IfFilterMatches::AutoDetectBehaviour )
        :   m_stringToMatch( toLower( testSpec ) ),
            m_filterType( matchBehaviour ),
            m_wildcardPosition( NoWildcard )
        {
            if( m_filterType == IfFilterMatches::AutoDetectBehaviour ) {
                if( startsWith( m_stringToMatch, "exclude:" ) ) {
                    m_stringToMatch = m_stringToMatch.substr( 8 );
                    m_filterType = IfFilterMatches::ExcludeTests;
                }
                else if( startsWith( m_stringToMatch, "~" ) ) {
                    m_stringToMatch = m_stringToMatch.substr( 1 );
                    m_filterType = IfFilterMatches::ExcludeTests;
                }
                else {
                    m_filterType = IfFilterMatches::IncludeTests;
                }
            }

            if( startsWith( m_stringToMatch, "*" ) ) {
                m_stringToMatch = m_stringToMatch.substr( 1 );
                m_wildcardPosition = (WildcardPosition)( m_wildcardPosition | WildcardAtStart );
            }
            if( endsWith( m_stringToMatch, "*" ) ) {
                m_stringToMatch = m_stringToMatch.substr( 0, m_stringToMatch.size()-1 );
                m_wildcardPosition = (WildcardPosition)( m_wildcardPosition | WildcardAtEnd );
            }
        }